

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonQuoteFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  undefined1 local_a8 [8];
  JsonString jx;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  jx._128_8_ = argv;
  jsonInit((JsonString *)local_a8,ctx);
  jsonAppendValue((JsonString *)local_a8,*(sqlite3_value **)jx._128_8_);
  jsonResult((JsonString *)local_a8);
  sqlite3_result_subtype(ctx,0x4a);
  return;
}

Assistant:

static void jsonQuoteFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonString jx;
  UNUSED_PARAMETER(argc);

  jsonInit(&jx, ctx);
  jsonAppendValue(&jx, argv[0]);
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}